

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_derive.cpp
# Opt level: O2

void derive_functions::deravgpres
               (Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
               Real param_7,int *param_8,int param_9)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  double *pdVar33;
  long lVar34;
  double *local_f0;
  double *local_d8;
  
  pdVar17 = (datfab->super_BaseFab<double>).dptr;
  iVar6 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar7 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar22 = (long)iVar7;
  iVar8 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  iVar9 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar10 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  iVar11 = (derfab->super_BaseFab<double>).domain.bigend.vect[2];
  iVar12 = (bx->smallend).vect[0];
  iVar24 = (bx->smallend).vect[2];
  lVar23 = (long)iVar24;
  lVar5 = lVar23 * 8;
  lVar29 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
  lVar21 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1);
  local_d8 = (derfab->super_BaseFab<double>).dptr + ((long)iVar12 - (long)iVar9);
  iVar13 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar18 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar13) + 1);
  lVar20 = lVar21 * lVar29;
  lVar25 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar9) + 1);
  iVar9 = (bx->smallend).vect[1];
  iVar14 = (bx->bigend).vect[0];
  iVar15 = (bx->bigend).vect[1];
  iVar16 = (bx->bigend).vect[2];
  pdVar33 = pdVar17 + ((long)iVar12 - (long)iVar6);
  iVar24 = iVar24 - iVar8;
  lVar30 = (lVar23 - iVar8) * lVar21 * 8;
  local_f0 = pdVar33;
  while (iVar24 = iVar24 + 1, lVar23 <= iVar16) {
    lVar26 = (long)iVar24 * lVar21 * 8;
    lVar32 = (lVar23 - iVar8) * lVar20;
    lVar23 = lVar23 + 1;
    lVar34 = ((int)lVar23 - iVar8) * lVar20;
    lVar31 = (long)iVar9;
    while (lVar31 <= iVar15) {
      if (iVar14 < iVar12) {
        lVar31 = lVar31 + 1;
      }
      else {
        lVar19 = (lVar31 - lVar22) * lVar29;
        lVar1 = lVar31 + 1;
        lVar27 = (long)((int)lVar1 - iVar7);
        lVar2 = lVar31 * 8;
        lVar3 = lVar31 * 8;
        lVar4 = lVar31 * 8;
        lVar28 = 0;
        do {
          lVar31 = (long)((iVar12 - iVar6) + 1 + (int)lVar28);
          *(double *)
           ((long)local_d8 +
           lVar28 * 8 +
           ((lVar5 + (long)dcomp * (long)((iVar11 - iVar10) + 1) * 8 + (long)iVar10 * -8) * lVar18 +
            (long)iVar13 * -8 + lVar2) * lVar25) =
               (pdVar17[lVar19 + lVar31 + lVar32] +
                *(double *)((long)local_f0 + lVar28 * 8 + (lVar30 + lVar22 * -8 + lVar4) * lVar29) +
                pdVar17[lVar27 * lVar29 + lVar31 + lVar32] +
                *(double *)((long)local_f0 + lVar28 * 8 + (lVar30 + lVar27 * 8) * lVar29) +
                pdVar17[lVar19 + lVar31 + lVar34] +
                *(double *)((long)pdVar33 + lVar28 * 8 + (lVar22 * -8 + lVar26 + lVar3) * lVar29) +
                pdVar17[lVar27 * lVar29 + lVar31 + lVar34] +
               *(double *)((long)pdVar33 + lVar28 * 8 + (lVar26 + lVar27 * 8) * lVar29)) * 0.125;
          lVar28 = lVar28 + 1;
          lVar31 = lVar1;
        } while ((iVar14 - iVar12) + 1 != (int)lVar28);
      }
    }
    local_d8 = local_d8 + lVar18 * lVar25;
    local_f0 = local_f0 + lVar20;
  }
  return;
}

Assistant:

void deravgpres (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
		   const FArrayBox& datfab, const Geometry& /*geomdata*/,
		   Real /*time*/, const int* /*bcrec*/, int /*level*/)

  {
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(Box(datfab.box()).enclosedCells().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= 1);
    AMREX_ASSERT(ncomp == 1);

    auto const in_dat = datfab.array();
    auto          der = derfab.array(dcomp);
#if (AMREX_SPACEDIM == 2 )
    Real factor = 0.25;
#elif (AMREX_SPACEDIM == 3 )
    Real factor = 0.125;
#endif

    amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
      der(i,j,k) =  factor * (  in_dat(i+1,j,k)     + in_dat(i,j,k)
				+ in_dat(i+1,j+1,k)   + in_dat(i,j+1,k)
#if (AMREX_SPACEDIM == 3 )
				+ in_dat(i+1,j,k+1)   + in_dat(i,j,k+1)
				+ in_dat(i+1,j+1,k+1) + in_dat(i,j+1,k+1)
#endif
				);
    });
  }